

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O1

int main(int argc,char **argv)

{
  __time_t _Var1;
  int iVar2;
  ulong uVar3;
  nvamemtiming_conf conf;
  timeval tv;
  nvamemtiming_conf nStack_68;
  timeval local_30;
  
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  iVar2 = nva_init();
  if (iVar2 == 0) {
    parse_cmd_line(argc,argv,&nStack_68);
    iVar2 = vbios_read(nStack_68.vbios.file,&nStack_68.vbios.data,&nStack_68.vbios.length);
    if (iVar2 == 1) {
      iVar2 = read_timings(&nStack_68);
      if (iVar2 == 0) {
        iVar2 = 0;
        gettimeofday(&local_30,(__timezone_ptr_t)0x0);
        _Var1 = local_30.tv_sec;
        switch(nStack_68.mode) {
        case MODE_AUTO:
          iVar2 = shallow_dump(&nStack_68);
          break;
        case MODE_BITFIELD:
          iVar2 = bitfield_check(&nStack_68);
          break;
        case MODE_MANUAL:
          iVar2 = manual_check(&nStack_68);
          break;
        case MODE_DEEP:
          iVar2 = deep_dump(&nStack_68);
        }
        gettimeofday(&local_30,(__timezone_ptr_t)0x0);
        uVar3 = local_30.tv_sec - _Var1;
        printf("The run tested %i configurations in %li:%li:%lis\n",(ulong)nStack_68.counter,
               uVar3 / 0xe10,(uVar3 % 0xe10) / 0x3c,uVar3 % 0x3c);
        return iVar2;
      }
      main_cold_3();
      return iVar2;
    }
    main_cold_2();
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char** argv)
{
	unsigned long start_time, total_time;
	struct nvamemtiming_conf conf;
	struct timeval tv;
	int ret;

	signal(SIGINT, signal_handler);
	signal(SIGSEGV, signal_handler);

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	parse_cmd_line(argc, argv, &conf);

	/* read the vbios */
	if (vbios_read(conf.vbios.file, &conf.vbios.data, &conf.vbios.length) != 1) {
		fprintf(stderr, "Error while reading the vbios\n");
		return 1;
	}

	/* parse the timing table */
	ret = read_timings(&conf);
	if (ret) {
		fprintf(stderr, "read_timings failed!\n");
		return ret;
	}

	/* start the counter to return how long did the run take */
	gettimeofday(&tv, NULL);
	start_time = tv.tv_sec;

	switch (conf.mode) {
	case MODE_AUTO:
		ret = shallow_dump(&conf);
		break;
	case MODE_DEEP:
		ret = deep_dump(&conf);
		break;
	case MODE_BITFIELD:
		ret = bitfield_check(&conf);
		break;
	case MODE_MANUAL:
		ret = manual_check(&conf);
		break;
	}

	gettimeofday(&tv, NULL);
	total_time = tv.tv_sec - start_time;

	printf("The run tested %i configurations in %li:%li:%lis\n",
	       conf.counter,
	       total_time / 3600,
	       (total_time % 3600) / 60,
	       total_time % 60);

	return ret;
}